

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O1

void __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::WriteF32
          (BinaryWriterSpec *this,uint32_t f32_bits,ExpectedNan expected)

{
  char *pcVar1;
  Stream *this_00;
  
  if (expected == Arithmetic) {
    this_00 = this->json_stream_;
    pcVar1 = "nan:arithmetic";
  }
  else {
    if (expected != Canonical) {
      if (expected == None) {
        Stream::Writef(this->json_stream_,"\"%u\"",f32_bits);
        return;
      }
      return;
    }
    this_00 = this->json_stream_;
    pcVar1 = "nan:canonical";
  }
  Stream::Writef(this_00,"\"%s\"",pcVar1);
  return;
}

Assistant:

void BinaryWriterSpec::WriteF32(uint32_t f32_bits, ExpectedNan expected) {
  switch (expected) {
    case ExpectedNan::None:
      json_stream_->Writef("\"%u\"", f32_bits);
      break;

    case ExpectedNan::Arithmetic:
      WriteString("nan:arithmetic");
      break;

    case ExpectedNan::Canonical:
      WriteString("nan:canonical");
      break;
  }
}